

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lanli.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  undefined4 uVar2;
  FILE *__stream;
  long lVar3;
  FILE *__stream_00;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  clock_t cVar7;
  clock_t cVar8;
  int *piVar9;
  char *pcVar10;
  size_t __n;
  long lVar11;
  char *pcVar12;
  void *__ptr;
  int iVar13;
  char *string;
  int iVar14;
  long lVar15;
  undefined *puVar16;
  int argn;
  bool bVar17;
  double dVar18;
  size_t sStack_d0;
  int local_c8;
  uint local_c4;
  long local_c0;
  int local_b4;
  char *local_b0;
  undefined8 local_a8;
  long local_a0;
  long local_98;
  char *local_90;
  undefined8 local_88;
  long local_80;
  long local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  char **local_40;
  FILE *local_38;
  
  local_b0 = *argv;
  local_a8 = 0;
  local_90 = (char *)0x0;
  local_38 = _stdin;
  local_88 = 0x300000000;
  local_80 = 0;
  local_68 = 0;
  local_c4 = 3;
  local_60 = 0x40;
  local_58 = 0x400;
  local_48 = 0x10;
  local_50 = 8;
  argn = 0;
  local_b4 = argc;
  local_40 = argv;
  iVar13 = 1;
  do {
    local_c8 = local_a8._4_4_;
    lVar11 = local_80;
    local_a0 = local_58;
    local_98 = local_60;
    local_78 = local_48;
    local_70 = local_50;
LAB_00102344:
    uVar2 = (undefined4)local_68;
    iVar14 = iVar13;
    if (argc <= iVar13) {
LAB_001027cc:
      local_a8 = CONCAT44(local_c8,(int)local_a8);
      local_88 = CONCAT44(local_c4,uVar2);
      local_98 = local_60;
      local_a0 = local_58;
      local_70 = local_50;
      local_78 = local_48;
      lVar15 = (long)iVar14;
      lVar3 = (long)local_b4;
      local_80 = lVar11;
      while( true ) {
        pcVar12 = local_90;
        if (lVar3 <= lVar15) {
          if ((int)local_a8 != 0) {
            return 0;
          }
          __stream_00 = local_38;
          if ((local_90 == (char *)0x0) ||
             (__stream_00 = fopen(local_90,"r"), __stream = _stderr, __stream_00 != (FILE *)0x0)) {
            puVar4 = (undefined8 *)lanli_buffer_new(local_a0);
            iVar13 = lanli_buffer_putf(puVar4,__stream_00);
            if (iVar13 == 0) {
              if (__stream_00 != _stdin) {
                fclose(__stream_00);
              }
              if ((local_88 & 0xffffffff) < 6) {
                puVar16 = (&PTR_lanli_callback_strict_post_00104d90)[local_88 & 0xffffffff];
              }
              else {
                puVar16 = (undefined *)0x0;
              }
              plVar5 = (long *)lanli_buffer_new(local_98);
              uVar6 = lanli_document_new(puVar16,0,local_88._4_4_,local_80,local_78,local_70);
              cVar7 = clock();
              lanli_document_render(uVar6,plVar5,*puVar4,puVar4[1]);
              cVar8 = clock();
              lanli_buffer_free(puVar4);
              lanli_document_free(uVar6);
              __ptr = (void *)*plVar5;
              __n = plVar5[1];
              if (__n == 0) {
                __n = 0;
              }
              else if (*(char *)((long)__ptr + (__n - 1)) != '\n') {
                lanli_buffer_putc(plVar5,10);
                __ptr = (void *)*plVar5;
                __n = plVar5[1];
              }
              fwrite(__ptr,1,__n,_stdout);
              lanli_buffer_free(plVar5);
              iVar13 = ferror(_stdout);
              if (iVar13 == 0) {
                if (local_a8._4_4_ == 0) {
                  return 0;
                }
                if (cVar8 == -1 || cVar7 == -1) {
                  fwrite("Failed to get the time.\n",0x18,1,_stderr);
                  return 1;
                }
                dVar18 = (double)(cVar8 - cVar7) / 1000000.0;
                if (1.0 <= dVar18) {
                  pcVar12 = "Time spent on rendering: %6.3f s.\n";
                }
                else {
                  dVar18 = dVar18 * 1000.0;
                  pcVar12 = "Time spent on rendering: %7.2f ms.\n";
                }
                fprintf(_stderr,pcVar12,dVar18);
                return 0;
              }
              pcVar12 = "I/O errors found while writing output.\n";
              sStack_d0 = 0x27;
            }
            else {
              pcVar12 = "I/O errors found while reading input.\n";
              sStack_d0 = 0x26;
            }
            fwrite(pcVar12,sStack_d0,1,_stderr);
          }
          else {
            piVar9 = __errno_location();
            pcVar10 = strerror(*piVar9);
            fprintf(__stream,"Unable to open input file \"%s\": %s\n",pcVar12,pcVar10);
          }
          return 5;
        }
        iVar13 = parse_argument(argn,local_40[lVar15],1,&local_b0);
        if (iVar13 == 0) break;
        argn = argn + 1;
        lVar15 = lVar15 + 1;
      }
      goto LAB_0010290b;
    }
    pcVar12 = local_40[iVar13];
    if ((*pcVar12 != '-') || (pcVar12[1] == '\0')) {
      local_a8 = CONCAT44(local_c8,(int)local_a8);
      local_88 = CONCAT44(local_c4,uVar2);
      local_98 = local_60;
      local_a0 = local_58;
      local_70 = local_50;
      local_78 = local_48;
      local_80 = lVar11;
      iVar14 = parse_argument(argn,pcVar12,0,&local_b0);
      if (iVar14 == 0) goto LAB_0010290b;
      argn = argn + 1;
      iVar14 = iVar13 + 1;
      goto LAB_00102788;
    }
    iVar14 = iVar13 + 1;
    if (iVar14 < argc) {
      pcVar10 = local_40[iVar14];
    }
    else {
      pcVar10 = (char *)0x0;
    }
    if (pcVar12[1] == '-') {
      if (pcVar12[2] == '\0') goto LAB_001027cc;
      if (pcVar10 == (char *)0x0) {
        bVar17 = false;
      }
      else {
        iVar14 = parseint(pcVar10,&local_c0);
        bVar17 = iVar14 != 0;
      }
      pcVar10 = pcVar12 + 2;
      iVar14 = strcmp(pcVar10,"help");
      if (iVar14 != 0) {
        iVar14 = strcmp(pcVar10,"version");
        if (iVar14 != 0) {
          iVar14 = strcmp(pcVar10,"time");
          if (iVar14 != 0) {
            iVar14 = strcmp(pcVar10,"levels");
            lVar3 = local_c0;
            if ((bool)(iVar14 == 0 & bVar17)) {
LAB_001024cd:
              iVar14 = 2;
              lVar11 = lVar3;
              goto LAB_001024d0;
            }
            iVar14 = strcmp(pcVar10,"max-nesting");
            lVar3 = lVar11;
            if ((bool)(iVar14 == 0 & bVar17)) {
              local_48 = local_c0;
              goto LAB_001024cd;
            }
            iVar14 = strcmp(pcVar10,"max-attributes");
            if ((bool)(iVar14 == 0 & bVar17)) {
              local_50 = local_c0;
              goto LAB_001024cd;
            }
            iVar14 = strcmp(pcVar10,"input-unit");
            if ((bool)(iVar14 == 0 & bVar17)) {
              local_58 = local_c0;
              goto LAB_001024cd;
            }
            iVar14 = strcmp(pcVar10,"output-unit");
            if ((bool)(iVar14 == 0 & bVar17)) {
              local_60 = local_c0;
              goto LAB_001024cd;
            }
            lVar3 = 8;
            do {
              lVar15 = lVar3;
              if (lVar15 + 0x18 == 0xb0) {
                lVar3 = 8;
                goto LAB_00102520;
              }
              iVar14 = strcmp(pcVar10,*(char **)((long)&callbacks_info[0].callback + lVar15));
              lVar3 = lVar15 + 0x18;
            } while (iVar14 != 0);
            local_68 = (ulong)*(uint *)((long)&__do_global_dtors_aux_fini_array_entry + lVar15);
            goto LAB_001025cc;
          }
          iVar14 = 1;
          local_c8 = iVar14;
          goto LAB_001024d0;
        }
        goto LAB_001028f7;
      }
      goto LAB_001028df;
    }
    local_a8 = CONCAT44(local_c8,(int)local_a8);
    local_88 = CONCAT44(local_c4,uVar2);
    local_98 = local_60;
    local_a0 = local_58;
    local_70 = local_50;
    local_78 = local_48;
    pcVar12 = pcVar12 + 2;
    local_80 = lVar11;
    while( true ) {
      cVar1 = pcVar12[-1];
      if ((int)cVar1 == 0) break;
      string = pcVar10;
      if (*pcVar12 != '\0') {
        string = pcVar12;
      }
      if (string == (char *)0x0) {
        bVar17 = false;
      }
      else {
        iVar13 = parseint(string,&local_c0);
        bVar17 = iVar13 != 0;
      }
      if (cVar1 != 'T') {
        lVar11 = local_80;
        if (cVar1 == 'v') goto LAB_001028f7;
        if (cVar1 == 'h') goto LAB_001028df;
        local_a8 = CONCAT44(local_c8,(int)local_a8);
        if ((bool)(cVar1 == 'l' & bVar17)) {
          local_80 = local_c0;
        }
        else if ((bool)(cVar1 == 'n' & bVar17)) {
          local_78 = local_c0;
        }
        else if ((bool)(cVar1 == 'a' & bVar17)) {
          local_70 = local_c0;
        }
        else if ((bool)(cVar1 == 'i' & bVar17)) {
          local_a0 = local_c0;
        }
        else {
          if (!(bool)(cVar1 == 'o' & bVar17)) {
            fprintf(_stderr,"Wrong option \'-%c\' found.\n",(ulong)(uint)(int)cVar1);
            goto LAB_0010290b;
          }
          local_98 = local_c0;
        }
        iVar14 = iVar14 + (uint)(string == pcVar10);
        argc = local_b4;
        goto LAB_00102788;
      }
      pcVar12 = pcVar12 + 1;
      local_c8 = 1;
    }
    local_a8 = CONCAT44(local_c8,(int)local_a8);
    argc = local_b4;
LAB_00102788:
    local_68 = local_88 & 0xffffffff;
    local_c4 = local_88._4_4_;
    local_58 = local_a0;
    local_60 = local_98;
    local_50 = local_70;
    local_48 = local_78;
    iVar13 = iVar14;
  } while( true );
  while (iVar14 = strcmp(pcVar10,*(char **)((long)&flags_info[0].flag + lVar15)),
        lVar3 = lVar15 + 0x18, iVar14 != 0) {
LAB_00102520:
    lVar15 = lVar3;
    if (lVar15 + 0x18 == 0x80) {
      lVar3 = 0;
      goto LAB_00102563;
    }
  }
  local_c4 = local_c4 | *(uint *)((long)&callbacks_info[5].description + lVar15);
  goto LAB_001025cc;
LAB_00102563:
  if (lVar3 == 3) goto LAB_00102583;
  if (pcVar10[lVar3] != "no-"[lVar3]) goto LAB_00102a5b;
  lVar3 = lVar3 + 1;
  goto LAB_00102563;
LAB_00102583:
  if (pcVar12 + 5 == (char *)0x0) {
LAB_00102a5b:
    local_a8 = CONCAT44(local_c8,(int)local_a8);
    local_80 = lVar11;
    fprintf(_stderr,"Wrong option \'--%s\' found.\n",pcVar10);
    goto LAB_0010290b;
  }
  lVar3 = 8;
  do {
    lVar15 = lVar3;
    if (lVar15 + 0x18 == 0x80) goto LAB_00102a5b;
    iVar14 = strcmp(pcVar12 + 5,*(char **)((long)&flags_info[0].flag + lVar15));
    lVar3 = lVar15 + 0x18;
  } while (iVar14 != 0);
  local_c4 = local_c4 & ~*(uint *)((long)&callbacks_info[5].description + lVar15);
LAB_001025cc:
  iVar14 = 1;
LAB_001024d0:
  iVar13 = iVar13 + iVar14;
  argc = local_b4;
  goto LAB_00102344;
LAB_001028f7:
  local_80 = lVar11;
  local_a8 = CONCAT44(local_c8,(int)local_a8);
  print_version();
  goto LAB_00102903;
LAB_001028df:
  local_80 = lVar11;
  local_a8 = CONCAT44(local_c8,(int)local_a8);
  print_help(local_b0);
LAB_00102903:
  local_a8 = 1;
LAB_0010290b:
  return (uint)((int)local_a8 == 0);
}

Assistant:

int main(int argc, char **argv) {
  struct option_data data;
  clock_t t1, t2;
  FILE *file = stdin;
  lanli_buffer *ib, *ob;
  lanli_callback callback = NULL;
  void *opaque = NULL;
  lanli_document *document;

  /* Parse options */
  data.basename = argv[0];
  data.done = 0;
  data.show_time = 0;
  data.iunit = DEF_IUNIT;
  data.ounit = DEF_OUNIT;
  data.filename = NULL;
  data.callback = DEF_CALLBACK;
  data.flags = DEF_FLAGS;
  data.levels = DEF_LEVELS;
  data.max_nesting = DEF_MAX_NESTING;
  data.max_attributes = DEF_MAX_ATTRIBUTES;

  argc = parse_options(argc, argv, parse_short_option, parse_long_option, parse_argument, &data);
  if (data.done) return 0;
  if (!argc) return 1;

  /* Open input file, if needed */
  if (data.filename) {
    file = fopen(data.filename, "r");
    if (!file) {
      fprintf(stderr, "Unable to open input file \"%s\": %s\n", data.filename, strerror(errno));
      return 5;
    }
  }

  /* Read everything */
  ib = lanli_buffer_new(data.iunit);

  if (lanli_buffer_putf(ib, file)) {
    fprintf(stderr, "I/O errors found while reading input.\n");
    return 5;
  }

  if (file != stdin) fclose(file);

  /* Obtain the callback */
  switch (data.callback) {
    case CALLBACK_STRICT_POST:
      callback = lanli_callback_strict_post;
      break;
    case CALLBACK_ACCEPT:
      callback = callback_accept;
      break;
    case CALLBACK_ESCAPE:
      callback = callback_escape;
      break;
    case CALLBACK_SKIP:
      callback = callback_skip;
      break;
    case CALLBACK_IGNORE:
      callback = callback_ignore;
      break;
    case CALLBACK_VERBATIM:
      callback = callback_verbatim;
      break;
  };

  /* Sanitize input HTML */
  ob = lanli_buffer_new(data.ounit);
  document = lanli_document_new(callback, opaque, data.flags, data.levels, data.max_nesting, data.max_attributes);

  t1 = clock();
  lanli_document_render(document, ob, ib->data, ib->size);
  t2 = clock();

  /* Cleanup */
  lanli_buffer_free(ib);
  lanli_document_free(document);

  /* Write the result to stdout */
  if (ob->size && ob->data[ob->size-1] != '\n')
    lanli_buffer_putc(ob, '\n');

  (void)fwrite(ob->data, 1, ob->size, stdout);
  lanli_buffer_free(ob);

  if (ferror(stdout)) {
    fprintf(stderr, "I/O errors found while writing output.\n");
    return 5;
  }

  /* Show rendering time */
  if (data.show_time) {
    if (t1 == -1 || t2 == -1) {
      fprintf(stderr, "Failed to get the time.\n");
      return 1;
    }

    double elapsed = (double)(t2 - t1) / CLOCKS_PER_SEC;
    if (elapsed < 1)
      fprintf(stderr, "Time spent on rendering: %7.2f ms.\n", elapsed*1e3);
    else
      fprintf(stderr, "Time spent on rendering: %6.3f s.\n", elapsed);
  }

  return 0;
}